

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O2

ostream * flow::diagnostics::operator<<(ostream *os,BufferedReport *report)

{
  pointer pMVar1;
  Message *in_R8;
  pointer pMVar2;
  string_view format_str;
  string_view format_str_00;
  string local_50;
  
  pMVar1 = (report->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar2 = (report->messages_).
                super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1) {
    if (pMVar2->type == Warning) {
      format_str.size_ = (size_t)pMVar2;
      format_str.data_ = (char *)0xc;
      fmt::v5::format<flow::diagnostics::Message>(&local_50,(v5 *)"Warning: {}\n",format_str,in_R8);
      std::operator<<(os,(string *)&local_50);
    }
    else {
      format_str_00.size_ = (size_t)pMVar2;
      format_str_00.data_ = (char *)0xa;
      fmt::v5::format<flow::diagnostics::Message>(&local_50,(v5 *)"Error: {}\n",format_str_00,in_R8)
      ;
      std::operator<<(os,(string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BufferedReport& report) {
  for (const Message& message: report) {
    switch (message.type) {
      case Type::Warning:
        os << fmt::format("Warning: {}\n", message);
        break;
      default:
        os << fmt::format("Error: {}\n", message);
        break;
    }
  }
  return os;
}